

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_conf_dh_param_bin
              (mbedtls_ssl_config *conf,uchar *dhm_P,size_t P_len,uchar *dhm_G,size_t G_len)

{
  int iVar1;
  
  iVar1 = mbedtls_mpi_read_binary(&conf->dhm_P,dhm_P,P_len);
  if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_read_binary(&conf->dhm_G,dhm_G,G_len), iVar1 == 0)) {
    return 0;
  }
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  return iVar1;
}

Assistant:

int mbedtls_ssl_conf_dh_param_bin( mbedtls_ssl_config *conf,
                                   const unsigned char *dhm_P, size_t P_len,
                                   const unsigned char *dhm_G, size_t G_len )
{
    int ret;

    if( ( ret = mbedtls_mpi_read_binary( &conf->dhm_P, dhm_P, P_len ) ) != 0 ||
        ( ret = mbedtls_mpi_read_binary( &conf->dhm_G, dhm_G, G_len ) ) != 0 )
    {
        mbedtls_mpi_free( &conf->dhm_P );
        mbedtls_mpi_free( &conf->dhm_G );
        return( ret );
    }

    return( 0 );
}